

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login_message_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::LoginMessageTest_test_encode_and_decode_Test::TestBody
          (LoginMessageTest_test_encode_and_decode_Test *this)

{
  char *pcVar1;
  AssertHelper local_7d0;
  AssertionResult gtest_ar_1;
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4b8 [37];
  LoginMessage message1;
  LoginMessage message2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260 [36];
  LoginMessage message3;
  
  EncodeAndDecode((pixie *)&message1,(LoginMessage *)login_message);
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::pixie::LoginMessage,bidfx_public_api::price::pixie::LoginMessage>
            ((internal *)&message2,"login_message","EncodeAndDecode(login_message)",
             (LoginMessage *)login_message,&message1);
  LoginMessage::~LoginMessage(&message1);
  if (message2 == (LoginMessage)0x0) {
    testing::Message::Message((Message *)&message1);
    if (local_260[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((local_260[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&message3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x80,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&message3,(Message *)&message1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&message3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&message1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_260);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5f8,"mcandate",(allocator<char> *)&message2);
  std::__cxx11::string::string(local_618,(string *)PASSWORD_abi_cxx11_);
  std::__cxx11::string::string(local_638,(string *)ALIAS_abi_cxx11_);
  std::__cxx11::string::string(local_658,(string *)APPLICATION_abi_cxx11_);
  std::__cxx11::string::string(local_678,(string *)APPLICATION_VERSION_abi_cxx11_);
  std::__cxx11::string::string(local_4d8,(string *)API_abi_cxx11_);
  std::__cxx11::string::string(local_4f8,(string *)API_VERSION_abi_cxx11_);
  std::__cxx11::string::string(local_518,(string *)PRODUCT_SERIAL_NUMBER_abi_cxx11_);
  bidfx_public_api::price::pixie::LoginMessage::LoginMessage
            (&message1,local_5f8,local_618,local_638,local_658,local_678,local_4d8,local_4f8,
             local_518);
  std::__cxx11::string::~string(local_518);
  std::__cxx11::string::~string(local_4f8);
  std::__cxx11::string::~string(local_4d8);
  std::__cxx11::string::~string(local_678);
  std::__cxx11::string::~string(local_658);
  std::__cxx11::string::~string(local_638);
  std::__cxx11::string::~string(local_618);
  std::__cxx11::string::~string(local_5f8);
  std::__cxx11::string::string(local_698,(string *)USERNAME_abi_cxx11_);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6b8,"g1veMes0Mehoney",(allocator<char> *)&message3);
  std::__cxx11::string::string(local_6d8,(string *)ALIAS_abi_cxx11_);
  std::__cxx11::string::string(local_6f8,(string *)APPLICATION_abi_cxx11_);
  std::__cxx11::string::string(local_718,(string *)APPLICATION_VERSION_abi_cxx11_);
  std::__cxx11::string::string(local_538,(string *)API_abi_cxx11_);
  std::__cxx11::string::string(local_558,(string *)API_VERSION_abi_cxx11_);
  std::__cxx11::string::string(local_578,(string *)PRODUCT_SERIAL_NUMBER_abi_cxx11_);
  bidfx_public_api::price::pixie::LoginMessage::LoginMessage
            (&message2,local_698,local_6b8,local_6d8,local_6f8,local_718,local_538,local_558,
             local_578);
  std::__cxx11::string::~string(local_578);
  std::__cxx11::string::~string(local_558);
  std::__cxx11::string::~string(local_538);
  std::__cxx11::string::~string(local_718);
  std::__cxx11::string::~string(local_6f8);
  std::__cxx11::string::~string(local_6d8);
  std::__cxx11::string::~string(local_6b8);
  std::__cxx11::string::~string(local_698);
  std::__cxx11::string::string(local_738,(string *)USERNAME_abi_cxx11_);
  std::__cxx11::string::string(local_758,(string *)PASSWORD_abi_cxx11_);
  std::__cxx11::string::string<std::allocator<char>>
            (local_778,"matteo",(allocator<char> *)local_4b8);
  std::__cxx11::string::string(local_798,(string *)APPLICATION_abi_cxx11_);
  std::__cxx11::string::string(local_7b8,(string *)APPLICATION_VERSION_abi_cxx11_);
  std::__cxx11::string::string(local_598,(string *)API_abi_cxx11_);
  std::__cxx11::string::string(local_5b8,(string *)API_VERSION_abi_cxx11_);
  std::__cxx11::string::string(local_5d8,(string *)PRODUCT_SERIAL_NUMBER_abi_cxx11_);
  bidfx_public_api::price::pixie::LoginMessage::LoginMessage
            (&message3,local_738,local_758,local_778,local_798,local_7b8,local_598,local_5b8,
             local_5d8);
  std::__cxx11::string::~string(local_5d8);
  std::__cxx11::string::~string(local_5b8);
  std::__cxx11::string::~string(local_598);
  std::__cxx11::string::~string(local_7b8);
  std::__cxx11::string::~string(local_798);
  std::__cxx11::string::~string(local_778);
  std::__cxx11::string::~string(local_758);
  std::__cxx11::string::~string(local_738);
  EncodeAndDecode((pixie *)local_4b8,&message1);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::LoginMessage,bidfx_public_api::price::pixie::LoginMessage>
            ((internal *)&gtest_ar_1,"login_message","EncodeAndDecode(message1)",
             (LoginMessage *)login_message,(LoginMessage *)local_4b8);
  LoginMessage::~LoginMessage((LoginMessage *)local_4b8);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)local_4b8);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x84,pcVar1);
    testing::internal::AssertHelper::operator=(&local_7d0,(Message *)local_4b8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_4b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  EncodeAndDecode((pixie *)local_4b8,&message2);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::LoginMessage,bidfx_public_api::price::pixie::LoginMessage>
            ((internal *)&gtest_ar_1,"login_message","EncodeAndDecode(message2)",
             (LoginMessage *)login_message,(LoginMessage *)local_4b8);
  LoginMessage::~LoginMessage((LoginMessage *)local_4b8);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)local_4b8);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x85,pcVar1);
    testing::internal::AssertHelper::operator=(&local_7d0,(Message *)local_4b8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_4b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  EncodeAndDecode((pixie *)local_4b8,&message3);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::LoginMessage,bidfx_public_api::price::pixie::LoginMessage>
            ((internal *)&gtest_ar_1,"login_message","EncodeAndDecode(message3)",
             (LoginMessage *)login_message,(LoginMessage *)local_4b8);
  LoginMessage::~LoginMessage((LoginMessage *)local_4b8);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)local_4b8);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x86,pcVar1);
    testing::internal::AssertHelper::operator=(&local_7d0,(Message *)local_4b8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_4b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  LoginMessage::~LoginMessage(&message3);
  LoginMessage::~LoginMessage(&message2);
  LoginMessage::~LoginMessage(&message1);
  return;
}

Assistant:

TEST(LoginMessageTest, test_encode_and_decode)
{
    EXPECT_EQ(login_message, EncodeAndDecode(login_message));
    LoginMessage message1("mcandate", PASSWORD, ALIAS, APPLICATION, APPLICATION_VERSION, API, API_VERSION, PRODUCT_SERIAL_NUMBER);
    LoginMessage message2(USERNAME, "g1veMes0Mehoney", ALIAS, APPLICATION, APPLICATION_VERSION, API, API_VERSION, PRODUCT_SERIAL_NUMBER);
    LoginMessage message3(USERNAME, PASSWORD, "matteo", APPLICATION, APPLICATION_VERSION, API, API_VERSION, PRODUCT_SERIAL_NUMBER);
    EXPECT_NE(login_message, EncodeAndDecode(message1));
    EXPECT_NE(login_message, EncodeAndDecode(message2));
    EXPECT_NE(login_message, EncodeAndDecode(message3));
}